

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O2

void __thiscall helics::Endpoint::sendAt(Endpoint *this,char *data,size_t data_size,Time sendTime)

{
  _func_int *p_Var1;
  Core *pCVar2;
  InvalidFunctionCall *this_00;
  string_view message;
  
  if ((this->fed->_vptr_MessageFederate[-3][(long)&(this->fed->mfManager)._M_t] != (_func_int)0x2)
     && (p_Var1 = this->fed->_vptr_MessageFederate[-3],
        p_Var1[(long)&(this->fed->mfManager)._M_t] != (_func_int)0x1)) {
    this_00 = (InvalidFunctionCall *)
              __cxa_allocate_exception(0x28,p_Var1,data,data_size,sendTime.internalTimeCode);
    message._M_str = "messages not allowed outside of execution and initialization mode";
    message._M_len = 0x41;
    InvalidFunctionCall::InvalidFunctionCall(this_00,message);
    __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
  }
  pCVar2 = (this->super_Interface).mCore;
  (*pCVar2->_vptr_Core[0x4c])(pCVar2,(ulong)(uint)(this->super_Interface).handle.hid);
  return;
}

Assistant:

void Endpoint::sendAt(const char* data, size_t data_size, Time sendTime) const
{
    if ((fed->getCurrentMode() == Federate::Modes::EXECUTING) ||
        (fed->getCurrentMode() == Federate::Modes::INITIALIZING)) {
        mCore->sendAt(handle, data, data_size, sendTime);
    } else {
        throw(InvalidFunctionCall(
            "messages not allowed outside of execution and initialization mode"));
    }
}